

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O3

void setup_firstpass_data(AV1_COMMON *cm,FirstPassData *firstpass_data,int unit_rows,int unit_cols)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int *piVar4;
  FRAME_STATS *pFVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  long lVar12;
  
  piVar4 = (int *)aom_calloc((long)(unit_cols * unit_rows),4);
  firstpass_data->raw_motion_err_list = piVar4;
  if (piVar4 == (int *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate firstpass_data->raw_motion_err_list");
  }
  pFVar5 = (FRAME_STATS *)aom_calloc((long)(unit_cols * unit_rows),0x78);
  firstpass_data->mb_stats = pFVar5;
  if (pFVar5 == (FRAME_STATS *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate firstpass_data->mb_stats");
  }
  auVar3 = _DAT_004d0920;
  auVar2 = _DAT_004cd280;
  auVar1 = _DAT_004cd270;
  if (0 < unit_rows) {
    lVar6 = (ulong)(uint)unit_cols - 1;
    auVar9._8_4_ = (int)lVar6;
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
    lVar6 = 0x1a4;
    uVar7 = 0;
    auVar9 = auVar9 ^ _DAT_004cd280;
    do {
      if (0 < unit_cols) {
        pFVar5 = firstpass_data->mb_stats;
        lVar8 = 0;
        auVar11 = auVar1;
        auVar13 = auVar3;
        do {
          auVar14 = auVar11 ^ auVar2;
          iVar10 = auVar9._4_4_;
          if ((bool)(~(auVar14._4_4_ == iVar10 && auVar9._0_4_ < auVar14._0_4_ ||
                      iVar10 < auVar14._4_4_) & 1)) {
            *(undefined4 *)((long)&pFVar5[-3].intra_error + lVar8 + lVar6) = 0xffffffff;
          }
          if ((auVar14._12_4_ != auVar9._12_4_ || auVar14._8_4_ <= auVar9._8_4_) &&
              auVar14._12_4_ <= auVar9._12_4_) {
            *(undefined4 *)((long)&pFVar5[-2].intra_error + lVar8 + lVar6) = 0xffffffff;
          }
          auVar14 = auVar13 ^ auVar2;
          iVar15 = auVar14._4_4_;
          if (iVar15 <= iVar10 && (iVar15 != iVar10 || auVar14._0_4_ <= auVar9._0_4_)) {
            *(undefined4 *)((long)&pFVar5[-1].intra_error + lVar8 + lVar6) = 0xffffffff;
            *(undefined4 *)((long)&pFVar5->intra_error + lVar8 + lVar6) = 0xffffffff;
          }
          lVar12 = auVar11._8_8_;
          auVar11._0_8_ = auVar11._0_8_ + 4;
          auVar11._8_8_ = lVar12 + 4;
          lVar12 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 4;
          auVar13._8_8_ = lVar12 + 4;
          lVar8 = lVar8 + 0x1e0;
        } while ((ulong)(unit_cols + 3U >> 2) * 0x1e0 - lVar8 != 0);
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + (ulong)(uint)unit_cols * 0x78;
    } while (uVar7 != (uint)unit_rows);
  }
  return;
}

Assistant:

static void setup_firstpass_data(AV1_COMMON *const cm,
                                 FirstPassData *firstpass_data,
                                 const int unit_rows, const int unit_cols) {
  CHECK_MEM_ERROR(cm, firstpass_data->raw_motion_err_list,
                  aom_calloc(unit_rows * unit_cols,
                             sizeof(*firstpass_data->raw_motion_err_list)));
  CHECK_MEM_ERROR(
      cm, firstpass_data->mb_stats,
      aom_calloc(unit_rows * unit_cols, sizeof(*firstpass_data->mb_stats)));
  for (int j = 0; j < unit_rows; j++) {
    for (int i = 0; i < unit_cols; i++) {
      firstpass_data->mb_stats[j * unit_cols + i].image_data_start_row =
          INVALID_ROW;
    }
  }
}